

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.h
# Opt level: O0

void __thiscall PointBlock<3U>::PointBlock(PointBlock<3U> *this,Bounds *bounds_)

{
  Bounds<float> *in_RDI;
  Bounds<float> *in_stack_ffffffffffffffe0;
  
  diy::Bounds<float>::Bounds(in_stack_ffffffffffffffe0,in_RDI);
  diy::Bounds<float>::Bounds(in_stack_ffffffffffffffe0,(int)((ulong)in_RDI >> 0x20));
  std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::vector
            ((vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)0x18ec20);
  return;
}

Assistant:

PointBlock(const Bounds& bounds_):
        bounds(bounds_)                         {}